

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

bool __thiscall
nuraft::asio_rpc_client::handle_custom_resp_meta
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          string *meta_str)

{
  asio_service_impl *paVar1;
  element_type *peVar2;
  bool bVar3;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp_1;
  undefined1 local_c9;
  shared_ptr<nuraft::rpc_exception> local_c8;
  shared_ptr<nuraft::resp_msg> local_b8;
  asio_service_meta_cb_params *local_a0;
  asio_service_meta_cb_params local_98 [2];
  char *local_30;
  
  paVar1 = this->impl_;
  peVar2 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98[0].dst_id_ = (peVar2->super_msg_base).dst_;
  local_98[0].commit_idx_ = peVar2->commit_idx_;
  local_98[0].term_ = (peVar2->super_msg_base).term_;
  local_98[0].msg_type_ = (peVar2->super_msg_base).type_;
  local_98[0].src_id_ = (peVar2->super_msg_base).src_;
  local_98[0].log_term_._0_4_ = (undefined4)peVar2->last_log_term_;
  local_98[0].log_term_._4_4_ = *(undefined4 *)((long)&peVar2->last_log_term_ + 4);
  local_98[0].log_idx_._0_4_ = (undefined4)peVar2->last_log_idx_;
  local_98[0].log_idx_._4_4_ = *(undefined4 *)((long)&peVar2->last_log_idx_ + 4);
  if ((paVar1->my_opt_).read_resp_meta_.super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar3 = (*(paVar1->my_opt_).read_resp_meta_._M_invoker)
                    ((_Any_data *)&(paVar1->my_opt_).read_resp_meta_,local_98,meta_str);
  if (!bVar3) {
    local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30 = "response meta verification failed: from peer %d, %s:%s";
    snprintf((char *)local_98,100,"response meta verification failed: from peer %d, %s:%s",
             (ulong)(uint)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->super_msg_base).dst_,(this->host_)._M_dataplus._M_p,
             (this->port_)._M_dataplus._M_p);
    local_c8.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a0 = local_98;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&local_c8.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&local_c8,
               (allocator<nuraft::rpc_exception> *)&local_c9,(char **)&local_a0,req);
    if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*when_done->_M_invoker)((_Any_data *)when_done,&local_b8,&local_c8);
    if (local_c8.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return bVar3;
}

Assistant:

bool handle_custom_resp_meta(ptr<req_msg>& req,
                                 ptr<resp_msg>& rsp,
                                 rpc_handler& when_done,
                                 const std::string& meta_str)
    {
        bool meta_ok = impl_->get_options().read_resp_meta_
                       ( req_to_params(req), meta_str );

        if (!meta_ok) {
            // Callback function returns false, should return failure.
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "response meta verification failed: "
                             "from peer %d, %s:%s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return false;
        }
        return true;
    }